

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

Polygon * __thiscall nite::Polygon::operator-(Polygon *__return_storage_ptr__,Polygon *this,float c)

{
  pointer pVVar1;
  pointer pVVar2;
  int i;
  ulong uVar3;
  
  Polygon(__return_storage_ptr__,this);
  pVVar1 = (__return_storage_ptr__->vert).
           super__Vector_base<nite::Vec2,_std::allocator<nite::Vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (__return_storage_ptr__->vert).
           super__Vector_base<nite::Vec2,_std::allocator<nite::Vec2>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (uVar3 = 0; uVar3 < (ulong)((long)pVVar2 - (long)pVVar1 >> 3); uVar3 = uVar3 + 1) {
    pVVar1[uVar3].x = pVVar1[uVar3].x - c;
    pVVar1[uVar3].y = pVVar1[uVar3].y - c;
  }
  return __return_storage_ptr__;
}

Assistant:

nite::Polygon nite::Polygon::operator-(float c){
	auto sub = *this;
	for(int i = 0; i < sub.vert.size(); ++i){
		sub.vert[i].x -= c;
		sub.vert[i].y -= c;
	}
	return sub;
}